

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::createBinOp(Builder *this,Op opCode,Id typeId,Id left,Id right)

{
  iterator __position;
  Block *pBVar1;
  Id IVar2;
  Instruction *instruction;
  Instruction *raw_instruction;
  pointer *__ptr;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_48;
  
  if (this->generatingOpCodeForSpecConst == true) {
    local_60._M_impl.super__Vector_impl_data._M_start = (pointer)::dxil_spv::allocate_in_thread(8);
    local_60._M_impl.super__Vector_impl_data._M_finish =
         local_60._M_impl.super__Vector_impl_data._M_start + 2;
    *local_60._M_impl.super__Vector_impl_data._M_start = left;
    local_60._M_impl.super__Vector_impl_data._M_start[1] = right;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_60._M_impl.super__Vector_impl_data._M_finish;
    IVar2 = createSpecConstantOp
                      (this,opCode,typeId,(Vector<Id> *)&local_60,(Vector<unsigned_int> *)&local_48)
    ;
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_48);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_60);
  }
  else {
    instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar2 = this->uniqueId + 1;
    this->uniqueId = IVar2;
    instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    instruction->resultId = IVar2;
    instruction->typeId = typeId;
    instruction->opCode = opCode;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    instruction->block = (Block *)0x0;
    local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = left;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &instruction->operands,(iterator)0x0,(uint *)&local_60);
    __position._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_60._M_impl.super__Vector_impl_data._M_start._4_4_,right);
    if (__position._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &instruction->operands,__position,(uint *)&local_60);
    }
    else {
      *__position._M_current = right;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pBVar1 = this->buildPoint;
    local_68._M_head_impl = instruction;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar1->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
    instruction->block = pBVar1;
    if (instruction->resultId != 0) {
      Module::mapInstruction(pBVar1->parent->parent,instruction);
    }
    if (local_68._M_head_impl != (Instruction *)0x0) {
      (*(local_68._M_head_impl)->_vptr_Instruction[1])();
    }
    IVar2 = instruction->resultId;
  }
  return IVar2;
}

Assistant:

Id Builder::createBinOp(Op opCode, Id typeId, Id left, Id right)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        dxil_spv::Vector<Id> operands(2);
        operands[0] = left; operands[1] = right;
        return createSpecConstantOp(opCode, typeId, operands, dxil_spv::Vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->addIdOperand(left);
    op->addIdOperand(right);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}